

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spi_tests.cpp
# Opt level: O0

void __thiscall test::spi_test::SPITest::SPITest(SPITest *this)

{
  int local_38;
  char cStack_31;
  int i;
  char cStack_2c;
  char cStack_2b;
  char cStack_2a;
  char ac_ [5];
  allocator<char> local_11;
  SPITest *local_10;
  SPITest *this_local;
  
  local_10 = this;
  iutest::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__SPITest_00624e18;
  this->null_str = (char *)0x0;
  this->a = 0;
  this->b = 0;
  this->fa = 0.0;
  this->da = 0.0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->sa,"a",&local_11);
  std::allocator<char>::~allocator(&local_11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->sb,"b",(allocator<char> *)(ac_ + 4));
  std::allocator<char>::~allocator((allocator<char> *)(ac_ + 4));
  std::__cxx11::string::string((string *)&this->sa2);
  TestObjectX::TestObjectX(&this->ox,0,1,2);
  TestObjectX::TestObjectX(&this->oy,0,0,0);
  cStack_2c = '\x01';
  cStack_2b = '\0';
  cStack_2a = '\0';
  ac_[0] = '\0';
  std::variant<int,float,std::__cxx11::string>::variant<int,void,void,int,void>
            ((variant<int,float,std::__cxx11::string> *)&this->v,(int *)&stack0xffffffffffffffd4);
  this->lda = (longdouble)0;
  _cStack_31 = 0x3020000;
  i._3_1_ = 5;
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
    this->ab[local_38] = local_38;
    this->aa2[local_38] = local_38;
    this->aa[local_38] = local_38;
    this->ac[local_38] = (&cStack_31)[local_38];
  }
  this->ab[5] = 5;
  return;
}

Assistant:

SPITest()
        : null_str(NULL)
        , a(0), b(0)
        , fa(0.0f)
        , da(0.0)
        , sa("a")
        , sb("b")
        , ox(0, 1, 2)
        , oy(0, 0, 0)
#if IUTEST_HAS_CXX_HDR_VARIANT
        , v(1)
#endif
#if IUTEST_HAS_LONG_DOUBLE
        , lda(0.0l)
#endif
    {
        const char ac_[5] = { 0, 0, 2, 3, 5 };
        for( int i=0; i < 5; ++i )
        {
            aa[i] = aa2[i] = ab[i] = i;
            ac[i] = ac_[i];
        }
        ab[5] = 5;
    }